

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

int __thiscall Confparse::SaveDefault(Confparse *this,path *filepath)

{
  byte bVar1;
  _Ios_Openmode __a;
  path *in_RSI;
  long in_RDI;
  bool bVar2;
  ofstream file;
  undefined1 in_stack_0000028f;
  path *in_stack_00000290;
  Confparse *in_stack_00000298;
  undefined4 in_stack_fffffffffffffdd0;
  char local_218 [512];
  path *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  std::ofstream::ofstream(local_218);
  __a = std::operator|(_S_out,_S_bin);
  std::operator|(__a,_S_ate);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)
             CONCAT44(__a,in_stack_fffffffffffffdd0),local_18,(openmode)((ulong)in_RDI >> 0x20));
  *(undefined1 *)(in_RDI + 0x2840) = 1;
  bVar1 = std::ofstream::is_open();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    std::ostream::write(local_218,0x304a70);
    std::ofstream::close();
    Load(in_stack_00000298,in_stack_00000290,(bool)in_stack_0000028f);
  }
  local_4 = (uint)!bVar2;
  std::ofstream::~ofstream(local_218);
  return local_4;
}

Assistant:

int Confparse::SaveDefault(const filesystem::path &filepath) {
	ofstream file;
	file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);

	nested = true;
	if (file.is_open()) {
		file.write(default_conf, sizeof(default_conf) - 1);
		file.close();
		Load(filepath);

		return 0;
	} else {
		return 1;
	}
}